

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

int Wlc_NtkPrepareBits(Wlc_Ntk_t *p)

{
  int iVar1;
  Wlc_Obj_t *p_00;
  undefined4 local_20;
  undefined4 local_1c;
  int nBits;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *p_local;
  
  local_20 = 0;
  Wlc_NtkCleanCopy(p);
  for (local_1c = 1; iVar1 = Wlc_NtkObjNumMax(p), local_1c < iVar1; local_1c = local_1c + 1) {
    p_00 = Wlc_NtkObj(p,local_1c);
    Wlc_ObjSetCopy(p,local_1c,local_20);
    iVar1 = Wlc_ObjRange(p_00);
    local_20 = iVar1 + local_20;
  }
  return local_20;
}

Assistant:

int Wlc_NtkPrepareBits( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    int i, nBits = 0;
    Wlc_NtkCleanCopy( p );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        Wlc_ObjSetCopy( p, i, nBits );
        nBits += Wlc_ObjRange(pObj);
    }
    return nBits;
}